

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,String *value)

{
  uint length;
  char *pcVar1;
  String *value_local;
  Value *this_local;
  
  Comments::Comments(&this->comments_);
  initBasic(this,stringValue,true);
  pcVar1 = (char *)std::__cxx11::string::data();
  length = std::__cxx11::string::length();
  pcVar1 = duplicateAndPrefixStringValue(pcVar1,length);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const String& value) {
  initBasic(stringValue, true);
  value_.string_ = duplicateAndPrefixStringValue(
      value.data(), static_cast<unsigned>(value.length()));
}